

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Own<kj::_::FiberStack,_std::nullptr_t> __thiscall kj::FiberPool::Impl::takeStack(Impl *this)

{
  bool bVar1;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *pdVar2;
  reference ppFVar3;
  FiberStack *pFVar4;
  FiberStack *extraout_RDX;
  FiberStack *extraout_RDX_00;
  FiberStack *extraout_RDX_01;
  Disposer *in_RSI;
  Own<kj::_::FiberStack,_std::nullptr_t> OVar5;
  FiberStack *result;
  FiberStack *result_2;
  undefined1 local_78 [8];
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  FiberStack *result_1;
  FiberStack **stackPtr;
  FiberStack **__end4;
  FiberStack **__begin4;
  FiberStack *(*__range4) [2];
  CoreLocalFreelist *core;
  CoreLocalFreelist *local_20;
  CoreLocalFreelist *_core594;
  Impl *this_local;
  
  this_local = this;
  lookupCoreLocalFreelist((Impl *)&core);
  local_20 = kj::_::readMaybe<kj::FiberPool::Impl::CoreLocalFreelist>
                       ((Maybe<kj::FiberPool::Impl::CoreLocalFreelist_&> *)&core);
  if (local_20 != (CoreLocalFreelist *)0x0) {
    for (__end4 = (FiberStack **)local_20;
        __end4 != (FiberStack **)((long)&local_20->field_0 + 0x10); __end4 = __end4 + 1) {
      LOCK();
      lock.ptr = (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)*__end4;
      *__end4 = (FiberStack *)0x0;
      UNLOCK();
      if ((FiberStack *)lock.ptr != (FiberStack *)0x0) {
        Own<kj::_::FiberStack,_std::nullptr_t>::Own
                  ((Own<kj::_::FiberStack,_std::nullptr_t> *)this,(FiberStack *)lock.ptr,in_RSI);
        pFVar4 = extraout_RDX;
        goto LAB_008735cd;
      }
      lock.ptr = (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)0x0;
    }
  }
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                 *)local_78,in_RSI + 3);
  pdVar2 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
           operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                       *)local_78);
  bVar1 = std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::empty(pdVar2);
  if (!bVar1) {
    pdVar2 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
             operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                         *)local_78);
    ppFVar3 = std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::back(pdVar2);
    pFVar4 = *ppFVar3;
    pdVar2 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
             operator->((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                         *)local_78);
    std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_back(pdVar2);
    Own<kj::_::FiberStack,_std::nullptr_t>::Own
              ((Own<kj::_::FiberStack,_std::nullptr_t> *)this,pFVar4,in_RSI);
  }
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked
            ((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *)
             local_78);
  pFVar4 = extraout_RDX_00;
  if (bVar1) {
    pFVar4 = (FiberStack *)operator_new(0x20);
    kj::_::FiberStack::FiberStack(pFVar4,(size_t)in_RSI[1]._vptr_Disposer);
    Own<kj::_::FiberStack,_std::nullptr_t>::Own
              ((Own<kj::_::FiberStack,_std::nullptr_t> *)this,pFVar4,in_RSI);
    pFVar4 = extraout_RDX_01;
  }
LAB_008735cd:
  OVar5.ptr = pFVar4;
  OVar5.disposer = &this->super_Disposer;
  return OVar5;
}

Assistant:

Own<_::FiberStack> takeStack() const {
    // Get a stack from the pool. The disposer on the returned Own pointer will return the stack
    // to the pool, provided that reset() has been called to indicate that the stack is not in
    // a weird state.

#if USE_CORE_LOCAL_FREELISTS
    KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
      for (auto& stackPtr: core.stacks) {
        _::FiberStack* result = __atomic_exchange_n(&stackPtr, nullptr, __ATOMIC_ACQUIRE);
        if (result != nullptr) {
          // Found a stack in this slot!
          return { result, *this };
        }
      }
      // No stacks found, fall back to global freelist.
    }
#endif

    {
      auto lock = freelist.lockExclusive();
      if (!lock->empty()) {
        _::FiberStack* result = lock->back();
        lock->pop_back();
        return { result, *this };
      }
    }

    _::FiberStack* result = new _::FiberStack(stackSize);
    return { result, *this };
  }